

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

void __thiscall Tokenizer::Tokenizer(Tokenizer *this,istream *stream)

{
  Mark *pMVar1;
  anon_class_1_0_00000001 local_49;
  Token local_48;
  
  (this->stream_).is_ = stream;
  (this->stream_).mark_.line = 1;
  (this->stream_).mark_.column = 0;
  pMVar1 = Stream::getMark(&this->stream_);
  (this->token_).type = EOT;
  *(undefined1 **)
   &(this->token_).value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_u =
       (undefined1 *)
       ((long)&(this->token_).value.
               super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
               super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_u + 0x10);
  *(undefined8 *)
   ((long)&(this->token_).value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_u + 8) = 0;
  (this->token_).value.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_u._M_first._M_storage.
  _M_storage[0x10] = '\0';
  (this->token_).value.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index = '\0';
  (this->token_).mark = *pMVar1;
  nextToken(&local_48,this);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr
    [local_48.value.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
            (&local_49,&local_48.value);
  return;
}

Assistant:

Tokenizer::Tokenizer(std::istream& stream): stream_(stream), token_(stream_.getMark())
{
  nextToken();
}